

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateGroupNonUniformBallotBitExtract
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  DiagnosticStream *pDVar3;
  DiagnosticStream local_790;
  uint32_t local_5b4;
  undefined1 local_5b0 [4];
  uint32_t id_type_id;
  DiagnosticStream local_3d8;
  uint32_t local_1fc;
  undefined1 local_1f8 [4];
  uint32_t value_type_id;
  Instruction *local_20;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_20 = inst;
  inst_local = (Instruction *)_;
  uVar2 = Instruction::type_id(inst);
  bVar1 = ValidationState_t::IsBoolScalarType(_,uVar2);
  if (bVar1) {
    local_1fc = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,local_20,3);
    bVar1 = ValidationState_t::IsUnsignedIntVectorType((ValidationState_t *)inst_local,local_1fc);
    if (bVar1) {
      uVar2 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_1fc);
      if (uVar2 == 4) {
        local_5b4 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,local_20,4);
        bVar1 = ValidationState_t::IsUnsignedIntScalarType
                          ((ValidationState_t *)inst_local,local_5b4);
        if (bVar1) {
          __local._4_4_ = SPV_SUCCESS;
        }
        else {
          ValidationState_t::diag
                    (&local_790,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,local_20);
          pDVar3 = DiagnosticStream::operator<<
                             (&local_790,(char (*) [38])"Id must be an unsigned integer scalar");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
          DiagnosticStream::~DiagnosticStream(&local_790);
        }
      }
      else {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_5b0,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_DATA,local_20);
        pDVar3 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)local_5b0,
                            (char (*) [52])"Value must be a 4-component unsigned integer vector");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_5b0);
      }
    }
    else {
      ValidationState_t::diag
                (&local_3d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,local_20);
      pDVar3 = DiagnosticStream::operator<<
                         (&local_3d8,
                          (char (*) [52])"Value must be a 4-component unsigned integer vector");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_3d8);
    }
  }
  else {
    ValidationState_t::diag
              ((DiagnosticStream *)local_1f8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               local_20);
    pDVar3 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_1f8,
                        (char (*) [32])"Result must be a boolean scalar");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1f8);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateGroupNonUniformBallotBitExtract(ValidationState_t& _,
                                                     const Instruction* inst) {
  if (!_.IsBoolScalarType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Result must be a boolean scalar";
  }

  const auto value_type_id = _.GetOperandTypeId(inst, 3);
  if (!_.IsUnsignedIntVectorType(value_type_id)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Value must be a 4-component unsigned integer vector";
  }

  if (_.GetDimension(value_type_id) != 4) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Value must be a 4-component unsigned integer vector";
  }

  const auto id_type_id = _.GetOperandTypeId(inst, 4);
  if (!_.IsUnsignedIntScalarType(id_type_id)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Id must be an unsigned integer scalar";
  }

  return SPV_SUCCESS;
}